

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::clear
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this)

{
  json_storage_kind jVar1;
  array_storage *this_00;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_RDI;
  object_storage *in_stack_00000030;
  undefined7 in_stack_fffffffffffffff0;
  
  jVar1 = storage_kind(in_RDI);
  if (jVar1 == json_reference) {
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::json_reference_storage>
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               CONCAT17(9,in_stack_fffffffffffffff0));
    json_reference_storage::value((json_reference_storage *)0x1f28be);
    clear((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
          CONCAT17(jVar1,in_stack_fffffffffffffff0));
  }
  else if (jVar1 == object) {
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage>
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               CONCAT17(0xd,in_stack_fffffffffffffff0));
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage::
    value_abi_cxx11_(in_stack_00000030);
    order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
    ::clear((order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
             *)0x1f28ab);
  }
  else if (jVar1 == array) {
    this_00 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
              cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::array_storage>
                        ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                          *)CONCAT17(0xe,in_stack_fffffffffffffff0));
    array_storage::value(this_00);
    json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
    ::clear((json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
             *)0x1f2890);
  }
  return;
}

Assistant:

void clear()
        {
            switch (storage_kind())
            {
                case json_storage_kind::array:
                    cast<array_storage>().value().clear();
                    break;
                case json_storage_kind::object:
                    cast<object_storage>().value().clear();
                    break;
                case json_storage_kind::json_reference:
                    cast<json_reference_storage>().value().clear();
                    break;
                default:
                    break;
            }
        }